

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall Game::PlaceFood(Game *this)

{
  bool bVar1;
  result_type x_00;
  result_type y_00;
  int y;
  int x;
  Game *this_local;
  
  do {
    do {
      x_00 = std::uniform_int_distribution<int>::operator()(&this->random_w,&this->engine);
      y_00 = std::uniform_int_distribution<int>::operator()(&this->random_h,&this->engine);
      bVar1 = Snake::SnakeCell(&this->snake,x_00,y_00);
    } while (bVar1);
    bVar1 = Map::MapCell(&this->map,x_00,y_00);
  } while (bVar1);
  (this->food).x = x_00;
  (this->food).y = y_00;
  return;
}

Assistant:

void Game::PlaceFood() {
    int x, y;
    while (true) {
        x = random_w(engine);
        y = random_h(engine);
        // Check that the location is not occupied by a snake or Map block item before placing
        // food.
        if (!snake.SnakeCell(x, y) && !map.MapCell(x, y)) {
            food.x = x;
            food.y = y;
            return;
        }
    }
}